

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O0

void __thiscall EventLoop::runInLoop(EventLoop *this,Functor *cb)

{
  bool bVar1;
  EventLoop *in_RSI;
  
  bVar1 = isInLoopThread(in_RSI);
  if (bVar1) {
    std::function<void_()>::operator()((function<void_()> *)in_RSI);
  }
  else {
    queueInLoop(this,cb);
  }
  return;
}

Assistant:

void EventLoop::runInLoop(Functor&& cb){
    if(isInLoopThread()){
        cb();
    }else{
        queueInLoop(std::move(cb));
    }
}